

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_TIFFPredictor.cc
# Opt level: O2

void __thiscall Pl_TIFFPredictor::processRow(Pl_TIFFPredictor *this)

{
  ulong uVar1;
  byte bVar2;
  pointer puVar3;
  byte *pbVar4;
  ulong *puVar5;
  ulong uVar6;
  uchar *p;
  long *plVar7;
  Pipeline *pPVar8;
  long lVar9;
  longlong lVar10;
  char cVar11;
  uint col;
  uint uVar12;
  ulong uVar13;
  long val;
  longlong *prev;
  ulong *puVar14;
  long *plVar15;
  byte *pbVar16;
  bool bVar17;
  BitStream in;
  BitWriter bw;
  BitStream local_70;
  BitWriter local_48;
  
  local_70.start = (uchar *)0x0;
  std::vector<long_long,_std::allocator<long_long>_>::_M_fill_assign
            (&this->previous,(ulong)this->samples_per_pixel,(value_type_conflict2 *)&local_70);
  if (this->bits_per_sample == 8) {
    puVar3 = (this->out).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->out).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar3) {
      (this->out).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar3;
    }
    pbVar16 = (this->cur_row).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pbVar4 = (this->cur_row).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    puVar5 = (ulong *)(this->previous).super__Vector_base<long_long,_std::allocator<long_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
    while (pbVar16 != pbVar4) {
      puVar14 = (ulong *)(this->previous).super__Vector_base<long_long,_std::allocator<long_long>_>.
                         _M_impl.super__Vector_impl_data._M_start;
      for (; (puVar14 != puVar5 && (pbVar16 != pbVar4)); pbVar16 = pbVar16 + 1) {
        bVar2 = *pbVar16;
        uVar6 = *puVar14;
        bVar17 = this->action == a_encode;
        uVar1 = uVar6 + bVar2;
        uVar13 = uVar1;
        if (bVar17) {
          uVar13 = (ulong)bVar2;
        }
        *puVar14 = uVar13;
        cVar11 = (char)uVar1;
        if (bVar17) {
          cVar11 = bVar2 - (char)uVar6;
        }
        local_70.start = (uchar *)CONCAT71(local_70.start._1_7_,cVar11);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (&this->out,(uchar *)&local_70);
        puVar14 = puVar14 + 1;
      }
    }
    pPVar8 = (this->super_Pipeline).next_;
    puVar3 = (this->out).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (*pPVar8->_vptr_Pipeline[2])
              (pPVar8,puVar3,
               (long)(this->out).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)puVar3);
  }
  else {
    BitWriter::BitWriter(&local_48,(this->super_Pipeline).next_);
    p = (this->cur_row).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start;
    BitStream::BitStream
              (&local_70,p,
               (long)(this->cur_row).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)p);
    for (uVar12 = 0; uVar12 < this->columns; uVar12 = uVar12 + 1) {
      plVar7 = (this->previous).super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (plVar15 = (this->previous).super__Vector_base<long_long,_std::allocator<long_long>_>.
                     _M_impl.super__Vector_impl_data._M_start; plVar15 != plVar7;
          plVar15 = plVar15 + 1) {
        lVar10 = BitStream::getBitsSigned(&local_70,(ulong)this->bits_per_sample);
        val = *plVar15 + lVar10;
        lVar9 = val;
        if (this->action == a_encode) {
          val = lVar10 - *plVar15;
          lVar9 = lVar10;
        }
        *plVar15 = lVar9;
        BitWriter::writeBitsSigned(&local_48,val,(ulong)this->bits_per_sample);
      }
    }
    BitWriter::flush(&local_48);
  }
  return;
}

Assistant:

void
Pl_TIFFPredictor::processRow()
{
    QTC::TC("libtests", "Pl_TIFFPredictor processRow", (action == a_decode ? 0 : 1));
    previous.assign(samples_per_pixel, 0);
    if (bits_per_sample != 8) {
        BitWriter bw(next());
        BitStream in(cur_row.data(), cur_row.size());
        for (unsigned int col = 0; col < this->columns; ++col) {
            for (auto& prev: previous) {
                long long sample = in.getBitsSigned(this->bits_per_sample);
                long long new_sample = sample;
                if (action == a_encode) {
                    new_sample -= prev;
                    prev = sample;
                } else {
                    new_sample += prev;
                    prev = new_sample;
                }
                bw.writeBitsSigned(new_sample, this->bits_per_sample);
            }
        }
        bw.flush();
    } else {
        out.clear();
        auto next_it = cur_row.begin();
        auto cr_end = cur_row.end();
        auto pr_end = previous.end();

        while (next_it != cr_end) {
            for (auto prev = previous.begin(); prev != pr_end && next_it != cr_end;
                 ++prev, ++next_it) {
                long long sample = *next_it;
                long long new_sample = sample;
                if (action == a_encode) {
                    new_sample -= *prev;
                    *prev = sample;
                } else {
                    new_sample += *prev;
                    *prev = new_sample;
                }
                out.push_back(static_cast<unsigned char>(255U & new_sample));
            }
        }
        next()->write(out.data(), out.size());
    }
}